

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_6d7a8::ParserImpl::ParseFunctionBody(ParserImpl *this)

{
  int iVar1;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar2;
  String *pSVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  Lexer *in_RAX;
  TokenDetail *pTVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  TokenDetail *pTVar10;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> uVar11;
  ParseException *pPVar12;
  pointer *__ptr;
  ParserImpl *in_RSI;
  iterator __position;
  undefined1 uVar13;
  Lexer *local_38;
  
  pTVar10 = &in_RSI->look_ahead_;
  local_38 = in_RAX;
  if ((in_RSI->look_ahead_).token_ == 0x11e) {
    luna::Lexer::GetToken(in_RSI->lexer_,pTVar10);
  }
  iVar1 = (in_RSI->look_ahead_).line_;
  pTVar7 = NextToken(in_RSI);
  if (pTVar7->token_ != 0x28) {
    pPVar12 = (ParseException *)__cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              (pPVar12,"unexpect token after \'function\', expect \'(\'",&in_RSI->current_);
LAB_0012e4ae:
    __cxa_throw(pPVar12,&luna::ParseException::typeinfo,luna::Exception::~Exception);
  }
  iVar6 = (in_RSI->look_ahead_).token_;
  if (iVar6 == 0x11e) {
    luna::Lexer::GetToken(in_RSI->lexer_,pTVar10);
    iVar6 = (in_RSI->look_ahead_).token_;
  }
  if (iVar6 == 0x29) {
    puVar9 = (undefined8 *)0x0;
  }
  else {
    if (iVar6 == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,pTVar10);
      iVar6 = (in_RSI->look_ahead_).token_;
    }
    if (iVar6 == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,pTVar10);
      iVar6 = (in_RSI->look_ahead_).token_;
    }
    else if (iVar6 == 0x115) {
      puVar8 = (undefined8 *)operator_new(0x20);
      *puVar8 = &PTR__NameList_001543d8;
      puVar8[1] = 0;
      puVar8[2] = 0;
      puVar8[3] = 0;
      pTVar7 = NextToken(in_RSI);
      __position._M_current = (TokenDetail *)puVar8[2];
      if (__position._M_current == (TokenDetail *)puVar8[3]) {
        std::vector<luna::TokenDetail,std::allocator<luna::TokenDetail>>::
        _M_realloc_insert<luna::TokenDetail_const&>
                  ((vector<luna::TokenDetail,std::allocator<luna::TokenDetail>> *)(puVar8 + 1),
                   __position,pTVar7);
        goto LAB_0012e2bf;
      }
      do {
        aVar2 = pTVar7->field_0;
        pSVar3 = pTVar7->module_;
        iVar6 = pTVar7->column_;
        iVar4 = pTVar7->token_;
        uVar5 = *(undefined4 *)&pTVar7->field_0x1c;
        (__position._M_current)->line_ = pTVar7->line_;
        (__position._M_current)->column_ = iVar6;
        (__position._M_current)->token_ = iVar4;
        *(undefined4 *)&(__position._M_current)->field_0x1c = uVar5;
        (__position._M_current)->field_0 = aVar2;
        (__position._M_current)->module_ = pSVar3;
        puVar8[2] = puVar8[2] + 0x20;
LAB_0012e2bf:
        while( true ) {
          iVar6 = (in_RSI->look_ahead_).token_;
          if (iVar6 == 0x11e) {
            luna::Lexer::GetToken(in_RSI->lexer_,pTVar10);
            iVar6 = (in_RSI->look_ahead_).token_;
          }
          if (iVar6 != 0x2c) {
            uVar13 = 0;
            goto LAB_0012e358;
          }
          NextToken(in_RSI);
          iVar6 = (in_RSI->look_ahead_).token_;
          if (iVar6 == 0x11e) {
            luna::Lexer::GetToken(in_RSI->lexer_,pTVar10);
            iVar6 = (in_RSI->look_ahead_).token_;
          }
          if (iVar6 != 0x115) {
            if (iVar6 == 0x11e) {
              luna::Lexer::GetToken(in_RSI->lexer_,pTVar10);
              iVar6 = (in_RSI->look_ahead_).token_;
            }
            if (iVar6 != 0x11d) {
              pPVar12 = (ParseException *)__cxa_allocate_exception(0x20);
              luna::ParseException::ParseException(pPVar12,"unexpect token in param list",pTVar10);
              __cxa_throw(pPVar12,&luna::ParseException::typeinfo,luna::Exception::~Exception);
            }
            uVar13 = 1;
            NextToken(in_RSI);
            goto LAB_0012e358;
          }
          pTVar7 = NextToken(in_RSI);
          __position._M_current = (TokenDetail *)puVar8[2];
          if (__position._M_current != (TokenDetail *)puVar8[3]) break;
          std::vector<luna::TokenDetail,std::allocator<luna::TokenDetail>>::
          _M_realloc_insert<luna::TokenDetail_const&>
                    ((vector<luna::TokenDetail,std::allocator<luna::TokenDetail>> *)(puVar8 + 1),
                     __position,pTVar7);
        }
      } while( true );
    }
    if (iVar6 != 0x11d) {
      pPVar12 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar12,"unexpect token in param list",pTVar10);
      goto LAB_0012e4ae;
    }
    NextToken(in_RSI);
    uVar13 = 1;
    puVar8 = (undefined8 *)0x0;
LAB_0012e358:
    puVar9 = (undefined8 *)operator_new(0x20);
    *puVar9 = &PTR__ParamList_00154398;
    puVar9[1] = puVar8;
    *(undefined1 *)(puVar9 + 2) = uVar13;
    puVar9[3] = 0;
  }
  pTVar10 = NextToken(in_RSI);
  if (pTVar10->token_ != 0x29) {
    pPVar12 = (ParseException *)__cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              (pPVar12,"unexpect token after param list, expect \')\'",&in_RSI->current_);
    __cxa_throw(pPVar12,&luna::ParseException::typeinfo,luna::Exception::~Exception);
  }
  ParseBlock((ParserImpl *)&stack0xffffffffffffffc8);
  pTVar10 = NextToken(in_RSI);
  if (pTVar10->token_ == 0x105) {
    uVar11._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
    .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
    super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
         (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         operator_new(0x20);
    *(undefined ***)
     uVar11._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
     _M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
     super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl = &PTR__FunctionBody_00154358;
    *(undefined8 **)
     ((long)uVar11._M_t.
            super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
            super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
            super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 8) = puVar9;
    *(Lexer **)
     ((long)uVar11._M_t.
            super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
            super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
            super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x10) = local_38;
    *(undefined1 *)
     ((long)uVar11._M_t.
            super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
            super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
            super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x18) = 0;
    *(int *)((long)uVar11._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 0x1c) = iVar1;
    this->lexer_ = (Lexer *)uVar11._M_t.
                            super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                            .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    return (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)
           uVar11._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  }
  pPVar12 = (ParseException *)__cxa_allocate_exception(0x20);
  luna::ParseException::ParseException
            (pPVar12,"unexpect token after function body, expect \'end\'",&in_RSI->current_);
  __cxa_throw(pPVar12,&luna::ParseException::typeinfo,luna::Exception::~Exception);
}

Assistant:

std::unique_ptr<SyntaxTree> ParseFunctionBody()
        {
            int line = LookAhead().line_;
            if (NextToken().token_ != '(')
                throw ParseException("unexpect token after 'function', expect '('", current_);

            std::unique_ptr<SyntaxTree> param_list;

            if (LookAhead().token_ != ')')
                param_list = ParseParamList();

            if (NextToken().token_ != ')')
                throw ParseException("unexpect token after param list, expect ')'", current_);

            std::unique_ptr<SyntaxTree> block = ParseBlock();

            if (NextToken().token_ != Token_End)
                throw ParseException("unexpect token after function body, expect 'end'", current_);

            return std::unique_ptr<SyntaxTree>(new FunctionBody(std::move(param_list),
                                                                std::move(block), line));
        }